

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deal.cpp
# Opt level: O2

int __thiscall Deal::scoreIfWon(Deal *this,int nbrOfOddTricks)

{
  int iVar1;
  Type TVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = Contract::getTricksAmount(this->_contract);
  TVar2 = Contract::getColor(this->_contract);
  if (TVar2 < HEART) {
    iVar4 = nbrOfOddTricks * 0x14;
  }
  else if (TVar2 - HEART < 2) {
    iVar4 = nbrOfOddTricks * 0x1e;
  }
  else {
    iVar4 = 0;
    if (TVar2 == NOTRUMP) {
      iVar4 = nbrOfOddTricks * 0x1e + 10;
    }
  }
  iVar5 = 1000;
  if (iVar1 != 7) {
    iVar5 = 0;
  }
  iVar3 = 500;
  if (iVar1 != 6) {
    iVar3 = iVar5;
  }
  return iVar3 + iVar4;
}

Assistant:

int Deal::scoreIfWon(int nbrOfOddTricks) {
    int slamBonus;
    int contractPoints = 0;

    switch (_contract->getTricksAmount()) {
        case 6:
            slamBonus = 500;
            break;
        case 7:
            slamBonus = 1000;
            break;
        default :
            slamBonus = 0;
            break;
    }

    switch (_contract->getColor()) {
        case Color::CLUB:
        case Color::DIAMOND:
            contractPoints = 20 * nbrOfOddTricks;
            break;
        case Color::HEART:
        case Color::SPADE:
            contractPoints = 30 * nbrOfOddTricks;
            break;
        case Color::NOTRUMP:
            contractPoints = 10 + 30 * nbrOfOddTricks;
            break;
    }

    return contractPoints + slamBonus;
}